

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

Error __thiscall asmjit::BaseEmitter::onAttach(BaseEmitter *this,CodeHolder *code)

{
  uint uVar1;
  
  this->_code = code;
  this->_environment = code->_environment;
  this->_emitterFlags = this->_emitterFlags | 1;
  uVar1 = (uint)(code->_environment)._arch;
  (this->_gpRegInfo)._signature =
       *(uint32_t *)((ulong)(uVar1 & 0x7f) * 0xd4 + 0x139014 + (ulong)(6 - (uVar1 & 1)) * 4);
  (*this->_vptr_BaseEmitter[0x12])();
  return 0;
}

Assistant:

Error BaseEmitter::onAttach(CodeHolder* code) noexcept {
  _code = code;
  _environment = code->environment();
  _addEmitterFlags(kFlagAttached);

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  uint32_t nativeRegType = Environment::is32Bit(code->arch()) ? BaseReg::kTypeGp32 : BaseReg::kTypeGp64;
  _gpRegInfo.setSignature(archTraits._regInfo[nativeRegType].signature());

  onSettingsUpdated();
  return kErrorOk;
}